

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromFraig(Fraig_Man_t *pMan,Abc_Ntk_t *pNtk)

{
  FILE *pFile;
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar2;
  Fraig_Node_t *pFVar3;
  Fraig_Node_t *pData;
  ProgressBar *p;
  Fraig_Node_t **ppFVar4;
  Abc_Obj_t *pFanin;
  int local_3c;
  int i;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkNew;
  ProgressBar *pProgress;
  Abc_Ntk_t *pNtk_local;
  Fraig_Man_t *pMan_local;
  
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
  for (local_3c = 0; iVar1 = Abc_NtkCiNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = Abc_NtkCi(pNtk,local_3c);
    pFVar3 = Fraig_ManReadIthVar(pMan,local_3c);
    Fraig_NodeSetData1(pFVar3,(Fraig_Node_t *)(pAVar2->field_6).pCopy);
  }
  pFVar3 = Fraig_ManReadConst1(pMan);
  pData = (Fraig_Node_t *)Abc_AigConst1(pNtk_00);
  Fraig_NodeSetData1(pFVar3,pData);
  pFile = _stdout;
  iVar1 = Abc_NtkCoNum(pNtk);
  p = Extra_ProgressBarStart(pFile,iVar1);
  for (local_3c = 0; iVar1 = Abc_NtkCoNum(pNtk), local_3c < iVar1; local_3c = local_3c + 1) {
    pAVar2 = Abc_NtkCo(pNtk,local_3c);
    Extra_ProgressBarUpdate(p,local_3c,(char *)0x0);
    ppFVar4 = Fraig_ManReadOutputs(pMan);
    pFanin = Abc_NodeFromFraig_rec(pNtk_00,ppFVar4[local_3c]);
    Abc_ObjAddFanin((pAVar2->field_6).pCopy,pFanin);
  }
  Extra_ProgressBarStop(p);
  Abc_NtkReassignIds(pNtk_00);
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromFraig( Fraig_Man_t * pMan, Abc_Ntk_t * pNtk )
{
    ProgressBar * pProgress;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pNode, * pNodeNew;
    int i;
    // create the new network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // make the mapper point to the new network
    Abc_NtkForEachCi( pNtk, pNode, i )
        Fraig_NodeSetData1( Fraig_ManReadIthVar(pMan, i), (Fraig_Node_t *)pNode->pCopy );
    // set the constant node
    Fraig_NodeSetData1( Fraig_ManReadConst1(pMan), (Fraig_Node_t *)Abc_AigConst1(pNtkNew) );
    // process the nodes in topological order
    pProgress = Extra_ProgressBarStart( stdout, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        pNodeNew = Abc_NodeFromFraig_rec( pNtkNew, Fraig_ManReadOutputs(pMan)[i] );
        Abc_ObjAddFanin( pNode->pCopy, pNodeNew );
    }
    Extra_ProgressBarStop( pProgress );
    Abc_NtkReassignIds( pNtkNew );
    return pNtkNew;
}